

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O3

cio_http_cb_return data_callback_write_response(cio_http_client *c,char *at,size_t length)

{
  cio_http_location_handler *pcVar1;
  
  pcVar1 = c->current_handler;
  pcVar1[1].on_fragment = (cio_http_data_cb_t)"Hello World!";
  pcVar1[1].on_header_field_name = (cio_http_data_cb_t)0xd;
  pcVar1[1].on_path = (cio_http_data_cb_t)(pcVar1 + 1);
  pcVar1[1].on_query = pcVar1[1].on_schema;
  *(cio_http_data_cb_t **)pcVar1[1].on_schema = &pcVar1[1].on_path;
  pcVar1[1].on_schema = (cio_http_data_cb_t)&pcVar1[1].on_path;
  pcVar1[1].on_host = pcVar1[1].on_host + 1;
  pcVar1[1].on_port = pcVar1[1].on_header_field_name + (long)pcVar1[1].on_port;
  (*c->write_response)
            (c,CIO_HTTP_STATUS_NOT_FOUND,(cio_write_buffer *)(pcVar1 + 1),
             (cio_response_written_cb_t)0x0);
  return CIO_HTTP_CB_SUCCESS;
}

Assistant:

static enum cio_http_cb_return data_callback_write_response(struct cio_http_client *c, const char *at, size_t length)
{
	(void)at;
	(void)length;

	static const char data[] = "Hello World!";
	struct cio_http_location_handler *handler = c->current_handler;
	struct dummy_handler *dh = cio_container_of(handler, struct dummy_handler, handler);
	cio_write_buffer_const_element_init(&dh->wb, data, sizeof(data));
	cio_write_buffer_queue_tail(&dh->wbh, &dh->wb);
	c->write_response(c, CIO_HTTP_STATUS_NOT_FOUND, &dh->wbh, NULL);
	return CIO_HTTP_CB_SUCCESS;
}